

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_DeadReckoningParameter.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::LE_DeadReckoningParameter::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LE_DeadReckoningParameter *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"LE Dead Reckoning Parameters:\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\tAlgorithm:          ",0x15);
  ENUMS::GetEnumAsStringDeadReckoningAlgorithm_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui8DeadRecknoningAlgorithm,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tLinear Acceleration: ",0x17);
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,(unsigned_char)3>>::GetAsString_abi_cxx11_
            (&local_1e0,&this->m_LinearAcceleration);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tAngular Velocity:    ",0x16);
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,(unsigned_char)3>>::GetAsString_abi_cxx11_
            (&local_200,&this->m_AngularVelocity);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString LE_DeadReckoningParameter::GetAsString() const
{
    KStringStream ss;

    ss << "LE Dead Reckoning Parameters:\n"
       << "\tAlgorithm:          "   << GetEnumAsStringDeadReckoningAlgorithm( m_ui8DeadRecknoningAlgorithm )
       << "\n\tLinear Acceleration: " << m_LinearAcceleration.GetAsString()
       << "\tAngular Velocity:    "   << m_AngularVelocity.GetAsString();

    return ss.str();
}